

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O2

void FindSpeakerAzimuths(ConfigInfo *config,float emitterAzimuth,uint8_t skipCenter,
                        SpeakerInfo **speakerInfo)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar1 = config->numNonLFSpeakers;
  uVar8 = (ulong)uVar1;
  fVar9 = 0.0;
  uVar3 = 0;
  fVar10 = 0.0;
  for (uVar5 = 0; uVar6 = uVar8, uVar8 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = (ulong)((int)uVar5 + 1);
    if (uVar8 - 1 == uVar5) {
      uVar3 = 0;
    }
    fVar9 = config->speakers[uVar5].azimuth;
    fVar10 = config->speakers[uVar3].azimuth;
    uVar6 = uVar5;
    if (fVar10 <= fVar9) {
      if (fVar9 <= emitterAzimuth) break;
LAB_00109cc4:
      if (emitterAzimuth < fVar10) break;
    }
    else if (fVar9 <= emitterAzimuth) goto LAB_00109cc4;
  }
  uVar2 = (uint)uVar3;
  uVar4 = (uint)uVar6;
  if (skipCenter != '\0') {
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      if ((fVar10 == 0.0) && (!NAN(fVar10))) {
        uVar7 = 0;
        if (uVar1 <= uVar2 + 1) {
          uVar7 = uVar1;
        }
        uVar2 = (uVar2 + 1) - uVar7;
      }
    }
    else if (uVar4 == 0) {
      uVar4 = uVar1 - 1;
    }
    else {
      uVar4 = uVar4 - 1;
    }
  }
  *speakerInfo = config->speakers + uVar4;
  speakerInfo[1] = config->speakers + uVar2;
  return;
}

Assistant:

static inline void FindSpeakerAzimuths(
	const ConfigInfo* config,
	float emitterAzimuth,
	uint8_t skipCenter,
	const SpeakerInfo **speakerInfo
) {
	uint32_t i, nexti = 0;
	float a0 = 0.0f, a1 = 0.0f;

	FAudio_assert(config != NULL);

	/* We want to find, given an azimuth, which speakers are the closest
	 * ones (in terms of angle) to that azimuth.
	 * This is done by iterating through the list of speaker azimuths, as
	 * given to us by the current ConfigInfo (which stores speaker azimuths
	 * in increasing order of azimuth for each possible speaker configuration;
	 * each speaker azimuth is defined to be between 0 and 2PI by construction).
	 */
	for (i = 0; i < config->numNonLFSpeakers; i += 1)
	{
		/* a0 and a1 are the azimuths of candidate speakers */
		a0 = config->speakers[i].azimuth;
		nexti = (i + 1) % config->numNonLFSpeakers;
		a1 = config->speakers[nexti].azimuth;

		if (a0 < a1)
		{
			if (emitterAzimuth >= a0 && emitterAzimuth < a1)
			{
				break;
			}
		}
		/* It is possible for a speaker pair to enclose the singulary at 0 == 2PI:
		 * consider for example the quad config, which has a front left speaker
		 * at 7PI/4 and a front right speaker at PI/4. In that case a0 = 7PI/4 and
		 * a1 = PI/4, and the way we know whether our current azimuth lies between
		 * that pair is by checking whether the azimuth is greather than 7PI/4 or
		 * whether it's less than PI/4. (By contract, currentAzimuth is always less
		 * than 2PI.)
		 */
		else
		{
			if (emitterAzimuth >= a0 || emitterAzimuth < a1)
			{
				break;
			}
		}
	}
	FAudio_assert(emitterAzimuth >= a0 || emitterAzimuth < a1);

	/* skipCenter means that we don't want to use the center speaker.
	 * The easiest way to deal with this is to check whether either of our candidate
	 * speakers are the center, which always has an azimuth of 0.0. If that is the case
	 * we just replace it with either the previous one or the next one.
	 */
	if (skipCenter)
	{
		if (a0 == 0.0f)
		{
			if (i == 0)
			{
				i = config->numNonLFSpeakers - 1;
			}
			else
			{
				i -= 1;
			}
		}
		else if (a1 == 0.0f)
		{
			nexti += 1;
			if (nexti >= config->numNonLFSpeakers)
			{
				nexti -= config->numNonLFSpeakers;
			}
		}
	}
	speakerInfo[0] = &config->speakers[i];
	speakerInfo[1] = &config->speakers[nexti];
}